

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SingleFileIndexedStorage.hpp
# Opt level: O2

KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_> __thiscall
supermap::
SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
::get(SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
      *this,unsigned_long index)

{
  long in_RDX;
  ByteArray<3UL> extraout_RDX;
  pointer *__ptr;
  KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_> KVar1;
  long *local_88;
  undefined1 local_80 [56];
  string local_48;
  
  getFileManager((SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_void>
                  *)local_80);
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2ul>,supermap::ByteArray<3ul>>,unsigned_long,void>
  ::getStorageFilePath_abi_cxx11_
            (&local_48,
             (SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2ul>,supermap::ByteArray<3ul>>,unsigned_long,void>
              *)index);
  std::filesystem::__cxx11::path::path((path *)(local_80 + 0x10),&local_48,auto_format);
  (**(code **)*(_func_int **)local_80._0_8_)(&local_88,local_80._0_8_,local_80 + 0x10,in_RDX * 5);
  io::
  InputIterator<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_5UL,_void>
  ::next((InputIterator<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<3UL>_>,_unsigned_long,_5UL,_void>
          *)this);
  if (local_88 != (long *)0x0) {
    (**(code **)(*local_88 + 0x18))();
  }
  std::filesystem::__cxx11::path::~path((path *)(local_80 + 0x10));
  std::__cxx11::string::~string((string *)&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 8));
  KVar1.value.data_._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
  ._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       extraout_RDX.data_._M_t.
       super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  KVar1._0_8_ = this;
  return KVar1;
}

Assistant:

[[nodiscard]] T get(IndexT index) const override {
        assert(index < getItemsCount());
        return getFileManager()->template getInputIterator<T, IndexT>(
            getStorageFilePath(),
            index * io::FixedDeserializedSizeRegister<T>::exactDeserializedSize
        ).next();
    }